

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service.hpp
# Opt level: O0

void __thiscall
asio::detail::reactive_socket_service<asio::ip::tcp>::
async_connect<std::function<void(std::error_code_const&)>,asio::any_io_executor>
          (reactive_socket_service<asio::ip::tcp> *this,implementation_type *impl,
          endpoint_type *peer_endpoint,function<void_(const_std::error_code_&)> *handler,
          any_io_executor *io_ex)

{
  bool bVar1;
  uint uVar2;
  reactive_socket_connect_op<std::function<void_(const_std::error_code_&)>,_asio::any_io_executor>
  *op;
  base_implementation_type *impl_00;
  long in_RSI;
  int *in_RDI;
  ptr p;
  associated_cancellation_slot_t<std::function<void_(const_std::error_code_&)>_> slot;
  bool is_continuation;
  function<void_(const_std::error_code_&)> *in_stack_ffffffffffffff38;
  function<void_(const_std::error_code_&)> *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  undefined8 in_stack_ffffffffffffff50;
  socket_type socket;
  error_code *in_stack_ffffffffffffff58;
  undefined1 is_continuation_00;
  reactive_socket_connect_op<std::function<void_(const_std::error_code_&)>,_asio::any_io_executor>
  *in_stack_ffffffffffffff60;
  reactor_op_cancellation *in_stack_ffffffffffffff70;
  reactive_socket_connect_op<std::function<void_(const_std::error_code_&)>,_asio::any_io_executor>
  *args_1;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  cancellation_slot local_38;
  byte local_29;
  undefined8 local_10;
  
  socket = (socket_type)((ulong)in_stack_ffffffffffffff50 >> 0x20);
  local_10 = in_RSI;
  local_29 = asio_handler_cont_helpers::is_continuation<std::function<void(std::error_code_const&)>>
                       ((function<void_(const_std::error_code_&)> *)0x704669);
  local_38.handler_ =
       (cancellation_handler_base **)
       get_associated_cancellation_slot<std::function<void(std::error_code_const&)>>
                 (in_stack_ffffffffffffff38);
  op = reactive_socket_connect_op<std::function<void_(const_std::error_code_&)>,_asio::any_io_executor>
       ::ptr::allocate(in_stack_ffffffffffffff40);
  reactive_socket_connect_op<std::function<void_(const_std::error_code_&)>,_asio::any_io_executor>::
  reactive_socket_connect_op
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,socket,
             (function<void_(const_std::error_code_&)> *)
             CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
             (any_io_executor *)in_stack_ffffffffffffff40);
  args_1 = op;
  bVar1 = cancellation_slot::is_connected(&local_38);
  if (bVar1) {
    in_stack_ffffffffffffff8c = 1;
    in_stack_ffffffffffffff70 =
         cancellation_slot::
         emplace<asio::detail::reactive_socket_service_base::reactor_op_cancellation,asio::detail::epoll_reactor*,asio::detail::epoll_reactor::descriptor_state**,int&,asio::detail::epoll_reactor::op_types>
                   ((cancellation_slot *)(local_10 + 8),
                    (epoll_reactor **)CONCAT44(1,in_stack_ffffffffffffff88),
                    (descriptor_state ***)args_1,in_RDI,(op_types *)in_stack_ffffffffffffff70);
    (op->super_reactive_socket_connect_op_base).super_reactor_op.cancellation_key_ =
         in_stack_ffffffffffffff70;
  }
  in_RDI = in_RDI + 10;
  uVar2 = (uint)local_29;
  is_continuation_00 = local_10._7_1_;
  impl_00 = (base_implementation_type *)
            ip::basic_endpoint<asio::ip::tcp>::data((basic_endpoint<asio::ip::tcp> *)0x7047d0);
  ip::basic_endpoint<asio::ip::tcp>::size((basic_endpoint<asio::ip::tcp> *)0x7047e2);
  reactive_socket_service_base::
  start_connect_op<asio::detail::reactive_socket_connect_op<std::function<void(std::error_code_const&)>,asio::any_io_executor>>
            ((reactive_socket_service_base *)in_stack_ffffffffffffff70,impl_00,op,
             (bool)is_continuation_00,in_RDI,CONCAT44(uVar2,in_stack_ffffffffffffff48),args_1,
             (enable_if_t<is_same<typename_associated_immediate_executor<typename_reactive_socket_connect_op<function<void_(const_error_code_&)>,_any_io_executor>::handler_type,_typename_reactive_socket_connect_op<function<void_(const_error_code_&)>,_any_io_executor>::io_executor_type>::asio_associated_immediate_executor_is_unspecialised,_void>::value>
              *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  reactive_socket_connect_op<std::function<void_(const_std::error_code_&)>,_asio::any_io_executor>::
  ptr::~ptr((ptr *)0x70483f);
  return;
}

Assistant:

void async_connect(implementation_type& impl,
      const endpoint_type& peer_endpoint,
      Handler& handler, const IoExecutor& io_ex)
  {
    bool is_continuation =
      asio_handler_cont_helpers::is_continuation(handler);

    associated_cancellation_slot_t<Handler> slot
      = asio::get_associated_cancellation_slot(handler);

    // Allocate and construct an operation to wrap the handler.
    typedef reactive_socket_connect_op<Handler, IoExecutor> op;
    typename op::ptr p = { asio::detail::addressof(handler),
      op::ptr::allocate(handler), 0 };
    p.p = new (p.v) op(success_ec_, impl.socket_, handler, io_ex);

    // Optionally register for per-operation cancellation.
    if (slot.is_connected())
    {
      p.p->cancellation_key_ =
        &slot.template emplace<reactor_op_cancellation>(
            &reactor_, &impl.reactor_data_, impl.socket_, reactor::connect_op);
    }

    ASIO_HANDLER_CREATION((reactor_.context(), *p.p, "socket",
          &impl, impl.socket_, "async_connect"));

    start_connect_op(impl, p.p, is_continuation,
        peer_endpoint.data(), peer_endpoint.size(), &io_ex, 0);
    p.v = p.p = 0;
  }